

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O0

MidiEvent * __thiscall
smf::MidiFile::addMetaEvent(MidiFile *this,int aTrack,int aTick,int aType,string *metaData)

{
  value_type vVar1;
  value_type *pvVar2;
  reference pvVar3;
  MidiEvent *pMVar4;
  int local_58;
  int i;
  undefined1 local_48 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  int length;
  string *metaData_local;
  int aType_local;
  int aTick_local;
  int aTrack_local;
  MidiFile *this_local;
  
  buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = std::__cxx11::string::size();
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48,
             (long)buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._4_4_);
  for (local_58 = 0;
      local_58 <
      buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_; local_58 = local_58 + 1) {
    pvVar2 = (value_type *)std::__cxx11::string::operator[]((ulong)metaData);
    vVar1 = *pvVar2;
    pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48,
                        (long)local_58);
    *pvVar3 = vVar1;
  }
  pMVar4 = addMetaEvent(this,aTrack,aTick,aType,
                        (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
  return pMVar4;
}

Assistant:

MidiEvent* MidiFile::addMetaEvent(int aTrack, int aTick, int aType,
		const std::string& metaData) {
	int length = (int)metaData.size();
	std::vector<uchar> buffer;
	buffer.resize(length);
	int i;
	for (i=0; i<length; i++) {
		buffer[i] = (uchar)metaData[i];
	}
	return addMetaEvent(aTrack, aTick, aType, buffer);
}